

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layer_Dyy_leftcorner(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  bool *pbVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  bool *pbVar19;
  int _a;
  int iVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  float *pfVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int _a_1;
  int iVar44;
  int iVar45;
  int _a_2;
  int iVar46;
  int iVar47;
  float *data;
  int width_20;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  int data_width;
  
  auVar52 = in_ZMM20._0_16_;
  pfVar5 = layer->response;
  pbVar6 = layer->laplacian;
  iVar1 = iimage->data_width;
  iVar2 = layer->step;
  iVar3 = layer->filter_size;
  iVar10 = iVar3 / 3;
  iVar12 = (iVar3 + -1) - (iVar3 + -1 >> 0x1f) >> 1;
  iVar11 = iVar3 / 6;
  iVar4 = layer->width;
  iVar17 = layer->height;
  fVar56 = 1.0 / (float)(iVar3 * iVar3);
  pfVar7 = iimage->data;
  if (-6 < iVar3) {
    iVar13 = iVar10 + -1 + iVar1 * iVar12;
    iVar14 = iVar10 + -1 + ((iVar10 + -1) - iVar11) * iVar1;
    iVar25 = 0;
    auVar52 = vxorps_avx512vl(auVar52,auVar52);
    do {
      if (2 < iVar3) {
        iVar39 = iVar25 - iVar10;
        iVar15 = iimage->width;
        iVar33 = iimage->height;
        iVar37 = iVar39 + 1;
        if (iVar33 < iVar39 + 1) {
          iVar37 = iVar33;
        }
        iVar46 = iVar39 + iVar10 * 2;
        if (iVar33 <= iVar46) {
          iVar46 = iVar33;
        }
        iVar51 = (iVar37 + -1) * iVar1;
        iVar48 = (iVar46 + -1) * iVar1;
        if (iVar33 < iVar39) {
          iVar39 = iVar33;
        }
        iVar34 = iVar33;
        if (iVar25 < iVar33) {
          iVar34 = iVar25;
        }
        iVar20 = (iVar39 + -1) * iVar1;
        iVar40 = (iVar34 + -1) * iVar1;
        iVar44 = iVar25 + 1;
        if (iVar33 < iVar25 + 1) {
          iVar44 = iVar33;
        }
        iVar21 = iVar25 + 1 + iVar10;
        if (iVar21 < iVar33) {
          iVar33 = iVar21;
        }
        iVar41 = (iVar44 + -1) * iVar1;
        iVar21 = (iVar33 + -1) * iVar1;
        lVar18 = (long)((iVar25 / iVar2) * iVar4);
        lVar22 = 0;
        do {
          iVar24 = (int)lVar22;
          iVar27 = iVar24 - iVar12;
          if (iVar15 < iVar24 - iVar12) {
            iVar27 = iVar15;
          }
          iVar23 = (iVar3 - iVar12) + iVar24;
          if (iVar15 <= iVar23) {
            iVar23 = iVar15;
          }
          auVar62 = vfmadd213ss_fma(ZEXT416((uint)pfVar7[iVar14 + iVar24]),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)pfVar7[iVar13 + iVar24]));
          fVar57 = 0.0;
          fVar59 = 0.0;
          if ((0 < iVar37) && (0 < iVar27)) {
            fVar59 = pfVar7[iVar51 + iVar27 + -1];
          }
          if ((0 < iVar37) && (0 < iVar23)) {
            fVar57 = pfVar7[iVar51 + iVar23 + -1];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar46) && (0 < iVar27)) {
            fVar60 = pfVar7[iVar27 + -1 + iVar48];
          }
          if ((0 < iVar46) && (0 < iVar23)) {
            fVar58 = pfVar7[iVar23 + -1 + iVar48];
          }
          iVar27 = iVar24 - iVar11;
          if (iVar15 < iVar24 - iVar11) {
            iVar27 = iVar15;
          }
          iVar23 = (iVar10 - iVar11) + iVar24;
          if (iVar15 <= iVar23) {
            iVar23 = iVar15;
          }
          fVar61 = 0.0;
          if ((0 < iVar37) && (0 < iVar27)) {
            fVar61 = pfVar7[iVar51 + iVar27 + -1];
          }
          fVar63 = 0.0;
          if ((0 < iVar37) && (0 < iVar23)) {
            fVar63 = pfVar7[iVar51 + iVar23 + -1];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar46) && (0 < iVar27)) {
            fVar65 = pfVar7[iVar27 + -1 + iVar48];
          }
          if ((0 < iVar46) && (0 < iVar23)) {
            fVar64 = pfVar7[iVar23 + -1 + iVar48];
          }
          auVar8 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar57) - fVar60) + fVar58)),
                              ZEXT816(0) << 0x40);
          iVar27 = iVar24 + 1;
          if (iVar15 < iVar24 + 1) {
            iVar27 = iVar15;
          }
          iVar36 = iVar27 + -1;
          iVar23 = iVar24 + 1 + iVar10;
          if (iVar15 <= iVar23) {
            iVar23 = iVar15;
          }
          fVar57 = 0.0;
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                               ZEXT816(0) << 0x40);
          auVar8 = vfmadd132ss_fma(auVar53,auVar8,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar39) && (0 < iVar27)) {
            fVar59 = pfVar7[iVar20 + iVar36];
          }
          iVar49 = iVar23 + -1;
          if ((0 < iVar39) && (0 < iVar23)) {
            fVar57 = pfVar7[iVar20 + iVar49];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar34) && (0 < iVar27)) {
            fVar60 = pfVar7[iVar40 + iVar36];
          }
          if ((0 < iVar34) && (0 < iVar23)) {
            fVar58 = pfVar7[iVar40 + iVar49];
          }
          iVar50 = iVar24 - iVar10;
          if (iVar15 < iVar24 - iVar10) {
            iVar50 = iVar15;
          }
          iVar47 = iVar50 + -1;
          iVar32 = iVar15;
          if (iVar24 < iVar15) {
            iVar32 = iVar24;
          }
          fVar61 = 0.0;
          if ((0 < iVar44) && (0 < iVar50)) {
            fVar61 = pfVar7[iVar41 + iVar47];
          }
          iVar24 = iVar32 + -1;
          fVar63 = 0.0;
          if ((0 < iVar44) && (0 < iVar32)) {
            fVar63 = pfVar7[iVar41 + iVar24];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar33) && (0 < iVar50)) {
            fVar65 = pfVar7[iVar21 + iVar47];
          }
          if ((0 < iVar33) && (0 < iVar32)) {
            fVar64 = pfVar7[iVar21 + iVar24];
          }
          auVar53 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar53);
          if ((0 < iVar39) && (0 < iVar50)) {
            in_ZMM16 = ZEXT464((uint)pfVar7[iVar20 + iVar47]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar53);
          if ((0 < iVar39) && (0 < iVar32)) {
            in_ZMM17 = ZEXT464((uint)pfVar7[iVar20 + iVar24]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar53);
          if ((0 < iVar34) && (0 < iVar50)) {
            in_ZMM19 = ZEXT464((uint)pfVar7[iVar47 + iVar40]);
          }
          if ((0 < iVar34) && (0 < iVar32)) {
            in_ZMM18 = ZEXT464((uint)pfVar7[iVar24 + iVar40]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar53);
          if ((0 < iVar44) && (0 < iVar27)) {
            in_ZMM21 = ZEXT464((uint)pfVar7[iVar41 + iVar36]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar53);
          if ((0 < iVar44) && (0 < iVar23)) {
            in_ZMM22 = ZEXT464((uint)pfVar7[iVar41 + iVar49]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar53);
          if ((0 < iVar33) && (0 < iVar27)) {
            in_ZMM24 = ZEXT464((uint)pfVar7[iVar36 + iVar21]);
          }
          if ((0 < iVar33) && (0 < iVar23)) {
            in_ZMM23 = ZEXT464((uint)pfVar7[iVar49 + iVar21]);
          }
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar59 - fVar57) - fVar60))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                              ZEXT816(0) << 0x40);
          auVar54 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar54 = vsubss_avx512f(auVar54,in_ZMM19._0_16_);
          auVar54 = vaddss_avx512f(auVar54,in_ZMM18._0_16_);
          auVar55 = vmaxss_avx512f(auVar54,auVar52);
          auVar54 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar54 = vsubss_avx512f(auVar54,in_ZMM24._0_16_);
          auVar54 = vaddss_avx512f(auVar54,in_ZMM23._0_16_);
          auVar54 = vmaxss_avx(auVar54,ZEXT816(0) << 0x40);
          fVar59 = fVar56 * auVar8._0_4_;
          fVar57 = fVar56 * auVar62._0_4_;
          fVar60 = fVar56 * (((auVar53._0_4_ + auVar9._0_4_) - auVar55._0_4_) - auVar54._0_4_);
          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar60 * -0.81)),ZEXT416((uint)fVar59),
                                    ZEXT416((uint)fVar57));
          pfVar5[lVar18] = auVar62._0_4_;
          pbVar6[lVar18] = 0.0 <= fVar57 + fVar59;
          lVar18 = lVar18 + 1;
          lVar22 = lVar22 + iVar2;
        } while (lVar22 < iVar10);
      }
      iVar25 = iVar25 + iVar2;
      iVar13 = iVar13 + iVar2 * iVar1;
      iVar14 = iVar14 + iVar2 * iVar1;
    } while (iVar25 <= iVar11);
  }
  iVar14 = iVar11 + iVar2;
  uVar26 = iVar14 % iVar2;
  iVar13 = iVar14 - uVar26;
  if (iVar13 <= iVar12) {
    iVar25 = iVar10 + -1 + ((iVar12 + iVar14) - uVar26) * iVar1;
    iVar33 = iVar2 * iVar1;
    iVar15 = iVar10 + -1 + ((iVar14 + iVar10 + ~uVar26) - iVar11) * iVar1;
    iVar14 = iVar10 + -1 + ((~uVar26 + iVar14) - iVar11) * iVar1;
    auVar52 = vxorps_avx512vl(auVar52,auVar52);
    do {
      if (2 < iVar3) {
        iVar51 = (iVar13 / iVar2) * iVar4;
        iVar46 = iVar13 - iVar10;
        iVar37 = iimage->width;
        iVar39 = iimage->height;
        iVar48 = iVar46 + 1;
        if (iVar39 < iVar46 + 1) {
          iVar48 = iVar39;
        }
        iVar34 = iVar10 * 2 + iVar46;
        if (iVar39 <= iVar34) {
          iVar34 = iVar39;
        }
        iVar20 = (iVar48 + -1) * iVar1;
        iVar44 = (iVar34 + -1) * iVar1;
        if (iVar39 < iVar46) {
          iVar46 = iVar39;
        }
        iVar40 = iVar39;
        if (iVar13 < iVar39) {
          iVar40 = iVar13;
        }
        iVar41 = (iVar46 + -1) * iVar1;
        iVar24 = (iVar40 + -1) * iVar1;
        iVar21 = iVar13 + 1;
        if (iVar39 < iVar13 + 1) {
          iVar21 = iVar39;
        }
        iVar27 = iVar13 + 1 + iVar10;
        if (iVar27 < iVar39) {
          iVar39 = iVar27;
        }
        iVar23 = (iVar21 + -1) * iVar1;
        iVar27 = (iVar39 + -1) * iVar1;
        pfVar38 = pfVar5 + iVar51;
        pbVar19 = pbVar6 + iVar51;
        lVar18 = 0;
        do {
          iVar51 = (int)lVar18;
          iVar36 = iVar51 - iVar12;
          if (iVar37 < iVar51 - iVar12) {
            iVar36 = iVar37;
          }
          iVar49 = (iVar3 - iVar12) + iVar51;
          if (iVar37 <= iVar49) {
            iVar49 = iVar37;
          }
          auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar7[iVar15 + iVar51] - pfVar7[iVar14 + iVar51]
                                                  )),SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)pfVar7[iVar25 + iVar51]));
          fVar57 = 0.0;
          fVar59 = 0.0;
          if ((0 < iVar48) && (0 < iVar36)) {
            fVar59 = pfVar7[iVar20 + iVar36 + -1];
          }
          if ((0 < iVar48) && (0 < iVar49)) {
            fVar57 = pfVar7[iVar20 + iVar49 + -1];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar34) && (0 < iVar36)) {
            fVar60 = pfVar7[iVar36 + -1 + iVar44];
          }
          if ((0 < iVar34) && (0 < iVar49)) {
            fVar58 = pfVar7[iVar49 + -1 + iVar44];
          }
          iVar36 = iVar51 - iVar11;
          if (iVar37 < iVar51 - iVar11) {
            iVar36 = iVar37;
          }
          iVar49 = (iVar10 - iVar11) + iVar51;
          if (iVar37 <= iVar49) {
            iVar49 = iVar37;
          }
          fVar61 = 0.0;
          if ((0 < iVar48) && (0 < iVar36)) {
            fVar61 = pfVar7[iVar20 + iVar36 + -1];
          }
          fVar63 = 0.0;
          if ((0 < iVar48) && (0 < iVar49)) {
            fVar63 = pfVar7[iVar20 + iVar49 + -1];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar34) && (0 < iVar36)) {
            fVar65 = pfVar7[iVar36 + -1 + iVar44];
          }
          if ((0 < iVar34) && (0 < iVar49)) {
            fVar64 = pfVar7[iVar49 + -1 + iVar44];
          }
          auVar8 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar57) - fVar60) + fVar58)),
                              ZEXT816(0) << 0x40);
          iVar36 = iVar51 + 1;
          if (iVar37 < iVar51 + 1) {
            iVar36 = iVar37;
          }
          iVar50 = iVar36 + -1;
          iVar49 = iVar51 + 1 + iVar10;
          if (iVar37 <= iVar49) {
            iVar49 = iVar37;
          }
          fVar57 = 0.0;
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                               ZEXT816(0) << 0x40);
          auVar8 = vfmadd132ss_fma(auVar53,auVar8,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar46) && (0 < iVar36)) {
            fVar59 = pfVar7[iVar41 + iVar50];
          }
          iVar32 = iVar49 + -1;
          if ((0 < iVar46) && (0 < iVar49)) {
            fVar57 = pfVar7[iVar41 + iVar32];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar40) && (0 < iVar36)) {
            fVar60 = pfVar7[iVar24 + iVar50];
          }
          if ((0 < iVar40) && (0 < iVar49)) {
            fVar58 = pfVar7[iVar24 + iVar32];
          }
          iVar47 = iVar51 - iVar10;
          if (iVar37 < iVar51 - iVar10) {
            iVar47 = iVar37;
          }
          iVar42 = iVar47 + -1;
          iVar35 = iVar37;
          if (iVar51 < iVar37) {
            iVar35 = iVar51;
          }
          fVar61 = 0.0;
          if ((0 < iVar21) && (0 < iVar47)) {
            fVar61 = pfVar7[iVar23 + iVar42];
          }
          iVar51 = iVar35 + -1;
          fVar63 = 0.0;
          if ((0 < iVar21) && (0 < iVar35)) {
            fVar63 = pfVar7[iVar23 + iVar51];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar39) && (0 < iVar47)) {
            fVar65 = pfVar7[iVar27 + iVar42];
          }
          if ((0 < iVar39) && (0 < iVar35)) {
            fVar64 = pfVar7[iVar27 + iVar51];
          }
          auVar53 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar53);
          if ((0 < iVar46) && (0 < iVar47)) {
            in_ZMM16 = ZEXT464((uint)pfVar7[iVar41 + iVar42]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar53);
          if ((0 < iVar46) && (0 < iVar35)) {
            in_ZMM17 = ZEXT464((uint)pfVar7[iVar41 + iVar51]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar53);
          if ((0 < iVar40) && (0 < iVar47)) {
            in_ZMM19 = ZEXT464((uint)pfVar7[iVar42 + iVar24]);
          }
          if ((0 < iVar40) && (0 < iVar35)) {
            in_ZMM18 = ZEXT464((uint)pfVar7[iVar51 + iVar24]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar53);
          if ((0 < iVar21) && (0 < iVar36)) {
            in_ZMM21 = ZEXT464((uint)pfVar7[iVar23 + iVar50]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar53);
          if ((0 < iVar21) && (0 < iVar49)) {
            in_ZMM22 = ZEXT464((uint)pfVar7[iVar23 + iVar32]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar53);
          if ((0 < iVar39) && (0 < iVar36)) {
            in_ZMM24 = ZEXT464((uint)pfVar7[iVar50 + iVar27]);
          }
          if ((0 < iVar39) && (0 < iVar49)) {
            in_ZMM23 = ZEXT464((uint)pfVar7[iVar32 + iVar27]);
          }
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar59 - fVar57) - fVar60))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                              ZEXT816(0) << 0x40);
          auVar54 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar54 = vsubss_avx512f(auVar54,in_ZMM19._0_16_);
          auVar54 = vaddss_avx512f(auVar54,in_ZMM18._0_16_);
          auVar55 = vmaxss_avx512f(auVar54,auVar52);
          auVar54 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar54 = vsubss_avx512f(auVar54,in_ZMM24._0_16_);
          auVar54 = vaddss_avx512f(auVar54,in_ZMM23._0_16_);
          auVar54 = vmaxss_avx(auVar54,ZEXT816(0) << 0x40);
          fVar59 = fVar56 * auVar8._0_4_;
          fVar57 = fVar56 * auVar62._0_4_;
          fVar60 = fVar56 * (((auVar53._0_4_ + auVar9._0_4_) - auVar55._0_4_) - auVar54._0_4_);
          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar60 * -0.81)),ZEXT416((uint)fVar59),
                                    ZEXT416((uint)fVar57));
          *pfVar38 = auVar62._0_4_;
          *pbVar19 = 0.0 <= fVar57 + fVar59;
          lVar18 = lVar18 + iVar2;
          pfVar38 = pfVar38 + 1;
          pbVar19 = pbVar19 + 1;
        } while (lVar18 < iVar10);
      }
      iVar13 = iVar13 + iVar2;
      iVar25 = iVar25 + iVar33;
      iVar15 = iVar15 + iVar33;
      iVar14 = iVar14 + iVar33;
    } while (iVar13 <= iVar12);
  }
  iVar13 = (iVar10 + -1 + iVar2) / iVar2;
  if (-1 < iVar3) {
    iVar25 = iVar13 * iVar2;
    iVar14 = 0;
    auVar52 = vxorps_avx512vl(auVar52,auVar52);
    do {
      if (iVar25 < iVar4 * iVar2) {
        iVar37 = iVar14 - iVar10;
        iVar15 = iimage->height;
        iVar33 = iVar37 + 1;
        if (iVar15 < iVar37 + 1) {
          iVar33 = iVar15;
        }
        iVar39 = iVar37 + iVar10 * 2;
        if (iVar15 <= iVar39) {
          iVar39 = iVar15;
        }
        iVar34 = (iVar33 + -1) * iVar1;
        iVar48 = (iVar39 + -1) * iVar1;
        iVar51 = iVar14 - iVar12;
        iVar46 = iVar51;
        if (iVar15 < iVar51) {
          iVar46 = iVar15;
        }
        iVar44 = iVar51 + iVar3;
        if (iVar15 <= iVar51 + iVar3) {
          iVar44 = iVar15;
        }
        iVar21 = (iVar46 + -1) * iVar1;
        iVar20 = (iVar44 + -1) * iVar1;
        iVar40 = iVar14 - iVar11;
        iVar51 = iVar40;
        if (iVar15 < iVar40) {
          iVar51 = iVar15;
        }
        iVar41 = iVar40 + iVar10;
        if (iVar15 <= iVar40 + iVar10) {
          iVar41 = iVar15;
        }
        iVar24 = (iVar51 + -1) * iVar1;
        iVar40 = (iVar41 + -1) * iVar1;
        if (iVar15 < iVar37) {
          iVar37 = iVar15;
        }
        iVar27 = iVar15;
        if (iVar14 < iVar15) {
          iVar27 = iVar14;
        }
        iVar36 = (iVar37 + -1) * iVar1;
        iVar49 = (iVar27 + -1) * iVar1;
        iVar23 = iVar14 + 1;
        if (iVar15 < iVar14 + 1) {
          iVar23 = iVar15;
        }
        iVar50 = iVar14 + 1 + iVar10;
        if (iVar50 < iVar15) {
          iVar15 = iVar50;
        }
        iVar47 = (iVar23 + -1) * iVar1;
        iVar35 = (iVar15 + -1) * iVar1;
        lVar18 = (long)((iVar14 / iVar2) * iVar4 + iVar13);
        iVar50 = iimage->width;
        iVar32 = iVar25;
        do {
          iVar42 = iVar32 - iVar12;
          if (iVar50 < iVar32 - iVar12) {
            iVar42 = iVar50;
          }
          iVar16 = (iVar3 - iVar12) + iVar32;
          if (iVar50 <= iVar16) {
            iVar16 = iVar50;
          }
          fVar57 = 0.0;
          fVar59 = 0.0;
          if ((0 < iVar33) && (0 < iVar42)) {
            fVar59 = pfVar7[iVar34 + iVar42 + -1];
          }
          if ((0 < iVar33) && (0 < iVar16)) {
            fVar57 = pfVar7[iVar34 + iVar16 + -1];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar39) && (0 < iVar42)) {
            fVar60 = pfVar7[iVar42 + -1 + iVar48];
          }
          if ((0 < iVar39) && (0 < iVar16)) {
            fVar58 = pfVar7[iVar16 + -1 + iVar48];
          }
          iVar42 = iVar32 - iVar11;
          if (iVar50 < iVar32 - iVar11) {
            iVar42 = iVar50;
          }
          iVar16 = (iVar10 - iVar11) + iVar32;
          if (iVar50 <= iVar16) {
            iVar16 = iVar50;
          }
          auVar62 = ZEXT816(0) << 0x40;
          fVar61 = 0.0;
          if ((0 < iVar33) && (0 < iVar42)) {
            fVar61 = pfVar7[iVar34 + iVar42 + -1];
          }
          fVar63 = 0.0;
          if ((0 < iVar33) && (0 < iVar16)) {
            fVar63 = pfVar7[iVar34 + iVar16 + -1];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar39) && (0 < iVar42)) {
            fVar65 = pfVar7[iVar42 + -1 + iVar48];
          }
          if ((0 < iVar39) && (0 < iVar16)) {
            fVar64 = pfVar7[iVar16 + -1 + iVar48];
          }
          auVar8 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar57) - fVar60) + fVar58)),auVar62);
          iVar42 = -iVar10 + 1 + iVar32;
          if (iVar50 < iVar42) {
            iVar42 = iVar50;
          }
          iVar31 = iVar42 + -1;
          iVar16 = iVar10 + iVar32;
          if (iVar50 <= iVar10 + iVar32) {
            iVar16 = iVar50;
          }
          fVar57 = 0.0;
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                               ZEXT816(0) << 0x40);
          auVar8 = vfmadd132ss_fma(auVar53,auVar8,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar46) && (0 < iVar42)) {
            fVar59 = pfVar7[iVar21 + iVar31];
          }
          iVar28 = iVar16 + -1;
          if ((0 < iVar46) && (0 < iVar16)) {
            fVar57 = pfVar7[iVar21 + iVar28];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar44) && (0 < iVar42)) {
            fVar60 = pfVar7[iVar20 + iVar31];
          }
          if ((0 < iVar44) && (0 < iVar16)) {
            fVar58 = pfVar7[iVar20 + iVar28];
          }
          if ((0 < iVar51) && (0 < iVar42)) {
            auVar62 = ZEXT416((uint)pfVar7[iVar24 + iVar31]);
          }
          fVar61 = 0.0;
          if ((0 < iVar51) && (0 < iVar16)) {
            fVar61 = pfVar7[iVar24 + iVar28];
          }
          fVar65 = 0.0;
          fVar63 = 0.0;
          if ((0 < iVar41) && (0 < iVar42)) {
            fVar63 = pfVar7[iVar31 + iVar40];
          }
          if ((0 < iVar41) && (0 < iVar16)) {
            fVar65 = pfVar7[iVar28 + iVar40];
          }
          auVar53 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar57) - fVar60) + fVar58)),
                               ZEXT816(0) << 0x40);
          iVar42 = iVar32 + 1;
          if (iVar50 < iVar32 + 1) {
            iVar42 = iVar50;
          }
          iVar31 = iVar42 + -1;
          iVar16 = iVar32 + 1 + iVar10;
          if (iVar50 <= iVar16) {
            iVar16 = iVar50;
          }
          fVar57 = 0.0;
          auVar62 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((auVar62._0_4_ - fVar61) - fVar63))),
                               ZEXT816(0) << 0x40);
          auVar62 = vfmadd132ss_fma(auVar62,auVar53,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar37) && (0 < iVar42)) {
            fVar59 = pfVar7[iVar36 + iVar31];
          }
          iVar28 = iVar16 + -1;
          if ((0 < iVar37) && (0 < iVar16)) {
            fVar57 = pfVar7[iVar36 + iVar28];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar27) && (0 < iVar42)) {
            fVar60 = pfVar7[iVar49 + iVar31];
          }
          if ((0 < iVar27) && (0 < iVar16)) {
            fVar58 = pfVar7[iVar49 + iVar28];
          }
          iVar43 = -iVar10 + iVar32;
          if (iVar50 < iVar43) {
            iVar43 = iVar50;
          }
          iVar45 = iVar43 + -1;
          iVar30 = iVar50;
          if (iVar32 < iVar50) {
            iVar30 = iVar32;
          }
          fVar61 = 0.0;
          if ((0 < iVar23) && (0 < iVar43)) {
            fVar61 = pfVar7[iVar47 + iVar45];
          }
          iVar29 = iVar30 + -1;
          fVar63 = 0.0;
          if ((0 < iVar23) && (0 < iVar30)) {
            fVar63 = pfVar7[iVar47 + iVar29];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar15) && (0 < iVar43)) {
            fVar65 = pfVar7[iVar35 + iVar45];
          }
          if ((0 < iVar15) && (0 < iVar30)) {
            fVar64 = pfVar7[iVar35 + iVar29];
          }
          auVar53 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar53);
          if ((0 < iVar37) && (0 < iVar43)) {
            in_ZMM16 = ZEXT464((uint)pfVar7[iVar36 + iVar45]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar53);
          if ((0 < iVar37) && (0 < iVar30)) {
            in_ZMM17 = ZEXT464((uint)pfVar7[iVar36 + iVar29]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar53);
          if ((0 < iVar27) && (0 < iVar43)) {
            in_ZMM19 = ZEXT464((uint)pfVar7[iVar45 + iVar49]);
          }
          if ((0 < iVar27) && (0 < iVar30)) {
            in_ZMM18 = ZEXT464((uint)pfVar7[iVar29 + iVar49]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar53);
          if ((0 < iVar23) && (0 < iVar42)) {
            in_ZMM21 = ZEXT464((uint)pfVar7[iVar47 + iVar31]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar53);
          if ((0 < iVar23) && (0 < iVar16)) {
            in_ZMM22 = ZEXT464((uint)pfVar7[iVar47 + iVar28]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar53);
          if ((0 < iVar15) && (0 < iVar42)) {
            in_ZMM24 = ZEXT464((uint)pfVar7[iVar31 + iVar35]);
          }
          if ((0 < iVar15) && (0 < iVar16)) {
            in_ZMM23 = ZEXT464((uint)pfVar7[iVar28 + iVar35]);
          }
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar59 - fVar57) - fVar60))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                              ZEXT816(0) << 0x40);
          auVar54 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar54 = vsubss_avx512f(auVar54,in_ZMM19._0_16_);
          auVar54 = vaddss_avx512f(auVar54,in_ZMM18._0_16_);
          auVar55 = vmaxss_avx512f(auVar54,auVar52);
          auVar54 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar54 = vsubss_avx512f(auVar54,in_ZMM24._0_16_);
          auVar54 = vaddss_avx512f(auVar54,in_ZMM23._0_16_);
          auVar54 = vmaxss_avx(auVar54,ZEXT816(0) << 0x40);
          fVar59 = fVar56 * auVar8._0_4_;
          fVar57 = fVar56 * auVar62._0_4_;
          fVar60 = fVar56 * (((auVar53._0_4_ + auVar9._0_4_) - auVar55._0_4_) - auVar54._0_4_);
          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar60 * -0.81)),ZEXT416((uint)fVar59),
                                    ZEXT416((uint)fVar57));
          pfVar5[lVar18] = auVar62._0_4_;
          pbVar6[lVar18] = 0.0 <= fVar59 + fVar57;
          lVar18 = lVar18 + 1;
          iVar32 = iVar32 + iVar2;
        } while (iVar32 < iVar4 * iVar2);
      }
      iVar14 = iVar14 + iVar2;
    } while (iVar14 <= iVar12);
  }
  iVar13 = (iVar12 + iVar2) - (iVar12 + iVar2) % iVar2;
  iVar17 = iVar17 * iVar2;
  if (iVar13 < iVar17) {
    auVar52 = vxorps_avx512vl(auVar52,auVar52);
    do {
      if (0 < iVar4 * iVar2) {
        iVar15 = iVar13 - iVar10;
        iVar14 = iimage->height;
        iVar25 = iVar15 + 1;
        if (iVar14 < iVar15 + 1) {
          iVar25 = iVar14;
        }
        iVar33 = iVar15 + iVar10 * 2;
        if (iVar14 <= iVar33) {
          iVar33 = iVar14;
        }
        iVar48 = (iVar25 + -1) * iVar1;
        iVar39 = (iVar33 + -1) * iVar1;
        iVar46 = iVar13 - iVar12;
        iVar37 = iVar46;
        if (iVar14 < iVar46) {
          iVar37 = iVar14;
        }
        iVar51 = iVar46 + iVar3;
        if (iVar14 <= iVar46 + iVar3) {
          iVar51 = iVar14;
        }
        iVar20 = (iVar37 + -1) * iVar1;
        iVar34 = (iVar51 + -1) * iVar1;
        iVar44 = iVar13 - iVar11;
        iVar46 = iVar44;
        if (iVar14 < iVar44) {
          iVar46 = iVar14;
        }
        iVar40 = iVar44 + iVar10;
        if (iVar14 <= iVar44 + iVar10) {
          iVar40 = iVar14;
        }
        iVar21 = (iVar46 + -1) * iVar1;
        iVar44 = (iVar40 + -1) * iVar1;
        if (iVar14 < iVar15) {
          iVar15 = iVar14;
        }
        iVar41 = iVar14;
        if (iVar13 < iVar14) {
          iVar41 = iVar13;
        }
        iVar27 = (iVar15 + -1) * iVar1;
        iVar23 = (iVar41 + -1) * iVar1;
        iVar24 = iVar13 + 1;
        if (iVar14 < iVar13 + 1) {
          iVar24 = iVar14;
        }
        iVar36 = iVar13 + 1 + iVar10;
        if (iVar36 < iVar14) {
          iVar14 = iVar36;
        }
        iVar49 = (iVar24 + -1) * iVar1;
        iVar50 = (iVar14 + -1) * iVar1;
        lVar18 = (long)((iVar13 / iVar2) * iVar4);
        iVar36 = iimage->width;
        iVar32 = 0;
        do {
          iVar47 = iVar32 - iVar12;
          if (iVar36 < iVar32 - iVar12) {
            iVar47 = iVar36;
          }
          iVar35 = (iVar3 - iVar12) + iVar32;
          if (iVar36 <= iVar35) {
            iVar35 = iVar36;
          }
          fVar57 = 0.0;
          fVar59 = 0.0;
          if ((0 < iVar25) && (0 < iVar47)) {
            fVar59 = pfVar7[iVar48 + iVar47 + -1];
          }
          if ((0 < iVar25) && (0 < iVar35)) {
            fVar57 = pfVar7[iVar48 + iVar35 + -1];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar33) && (0 < iVar47)) {
            fVar60 = pfVar7[iVar47 + -1 + iVar39];
          }
          if ((0 < iVar33) && (0 < iVar35)) {
            fVar58 = pfVar7[iVar35 + -1 + iVar39];
          }
          iVar47 = iVar32 - iVar11;
          if (iVar36 < iVar32 - iVar11) {
            iVar47 = iVar36;
          }
          iVar35 = (iVar10 - iVar11) + iVar32;
          if (iVar36 <= iVar35) {
            iVar35 = iVar36;
          }
          auVar62 = ZEXT816(0) << 0x40;
          fVar61 = 0.0;
          if ((0 < iVar25) && (0 < iVar47)) {
            fVar61 = pfVar7[iVar48 + iVar47 + -1];
          }
          fVar63 = 0.0;
          if ((0 < iVar25) && (0 < iVar35)) {
            fVar63 = pfVar7[iVar48 + iVar35 + -1];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar33) && (0 < iVar47)) {
            fVar65 = pfVar7[iVar47 + -1 + iVar39];
          }
          if ((0 < iVar33) && (0 < iVar35)) {
            fVar64 = pfVar7[iVar35 + -1 + iVar39];
          }
          auVar8 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar57) - fVar60) + fVar58)),auVar62);
          iVar47 = -iVar10 + 1 + iVar32;
          if (iVar36 < iVar47) {
            iVar47 = iVar36;
          }
          iVar42 = iVar47 + -1;
          iVar35 = iVar10 + iVar32;
          if (iVar36 <= iVar10 + iVar32) {
            iVar35 = iVar36;
          }
          fVar57 = 0.0;
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                               ZEXT816(0) << 0x40);
          auVar8 = vfmadd132ss_fma(auVar53,auVar8,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar37) && (0 < iVar47)) {
            fVar59 = pfVar7[iVar20 + iVar42];
          }
          iVar16 = iVar35 + -1;
          if ((0 < iVar37) && (0 < iVar35)) {
            fVar57 = pfVar7[iVar20 + iVar16];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar51) && (0 < iVar47)) {
            fVar60 = pfVar7[iVar34 + iVar42];
          }
          if ((0 < iVar51) && (0 < iVar35)) {
            fVar58 = pfVar7[iVar34 + iVar16];
          }
          if ((0 < iVar46) && (0 < iVar47)) {
            auVar62 = ZEXT416((uint)pfVar7[iVar21 + iVar42]);
          }
          fVar61 = 0.0;
          if ((0 < iVar46) && (0 < iVar35)) {
            fVar61 = pfVar7[iVar21 + iVar16];
          }
          fVar65 = 0.0;
          fVar63 = 0.0;
          if ((0 < iVar40) && (0 < iVar47)) {
            fVar63 = pfVar7[iVar42 + iVar44];
          }
          if ((0 < iVar40) && (0 < iVar35)) {
            fVar65 = pfVar7[iVar16 + iVar44];
          }
          auVar53 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar57) - fVar60) + fVar58)),
                               ZEXT816(0) << 0x40);
          iVar47 = iVar32 + 1;
          if (iVar36 < iVar32 + 1) {
            iVar47 = iVar36;
          }
          iVar42 = iVar47 + -1;
          iVar35 = iVar32 + 1 + iVar10;
          if (iVar36 <= iVar35) {
            iVar35 = iVar36;
          }
          fVar57 = 0.0;
          auVar62 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((auVar62._0_4_ - fVar61) - fVar63))),
                               ZEXT816(0) << 0x40);
          auVar62 = vfmadd132ss_fma(auVar62,auVar53,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar15) && (0 < iVar47)) {
            fVar59 = pfVar7[iVar27 + iVar42];
          }
          iVar16 = iVar35 + -1;
          if ((0 < iVar15) && (0 < iVar35)) {
            fVar57 = pfVar7[iVar27 + iVar16];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar41) && (0 < iVar47)) {
            fVar60 = pfVar7[iVar23 + iVar42];
          }
          if ((0 < iVar41) && (0 < iVar35)) {
            fVar58 = pfVar7[iVar23 + iVar16];
          }
          iVar31 = -iVar10 + iVar32;
          if (iVar36 < iVar31) {
            iVar31 = iVar36;
          }
          iVar43 = iVar31 + -1;
          iVar28 = iVar36;
          if (iVar32 < iVar36) {
            iVar28 = iVar32;
          }
          fVar61 = 0.0;
          if ((0 < iVar24) && (0 < iVar31)) {
            fVar61 = pfVar7[iVar49 + iVar43];
          }
          iVar30 = iVar28 + -1;
          fVar63 = 0.0;
          if ((0 < iVar24) && (0 < iVar28)) {
            fVar63 = pfVar7[iVar49 + iVar30];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar14) && (0 < iVar31)) {
            fVar65 = pfVar7[iVar50 + iVar43];
          }
          if ((0 < iVar14) && (0 < iVar28)) {
            fVar64 = pfVar7[iVar50 + iVar30];
          }
          auVar53 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar53);
          if ((0 < iVar15) && (0 < iVar31)) {
            in_ZMM16 = ZEXT464((uint)pfVar7[iVar27 + iVar43]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar53);
          if ((0 < iVar15) && (0 < iVar28)) {
            in_ZMM17 = ZEXT464((uint)pfVar7[iVar27 + iVar30]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar53);
          if ((0 < iVar41) && (0 < iVar31)) {
            in_ZMM19 = ZEXT464((uint)pfVar7[iVar43 + iVar23]);
          }
          if ((0 < iVar41) && (0 < iVar28)) {
            in_ZMM18 = ZEXT464((uint)pfVar7[iVar30 + iVar23]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar53);
          if ((0 < iVar24) && (0 < iVar47)) {
            in_ZMM21 = ZEXT464((uint)pfVar7[iVar49 + iVar42]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar53);
          if ((0 < iVar24) && (0 < iVar35)) {
            in_ZMM22 = ZEXT464((uint)pfVar7[iVar49 + iVar16]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar53);
          if ((0 < iVar14) && (0 < iVar47)) {
            in_ZMM24 = ZEXT464((uint)pfVar7[iVar42 + iVar50]);
          }
          if ((0 < iVar14) && (0 < iVar35)) {
            in_ZMM23 = ZEXT464((uint)pfVar7[iVar16 + iVar50]);
          }
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar58 + ((fVar59 - fVar57) - fVar60))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                              ZEXT816(0) << 0x40);
          auVar54 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar54 = vsubss_avx512f(auVar54,in_ZMM19._0_16_);
          auVar54 = vaddss_avx512f(auVar54,in_ZMM18._0_16_);
          auVar55 = vmaxss_avx512f(auVar54,auVar52);
          auVar54 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar54 = vsubss_avx512f(auVar54,in_ZMM24._0_16_);
          auVar54 = vaddss_avx512f(auVar54,in_ZMM23._0_16_);
          auVar54 = vmaxss_avx(auVar54,ZEXT816(0) << 0x40);
          fVar59 = fVar56 * auVar8._0_4_;
          fVar57 = fVar56 * auVar62._0_4_;
          fVar60 = fVar56 * (((auVar53._0_4_ + auVar9._0_4_) - auVar55._0_4_) - auVar54._0_4_);
          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar60 * -0.81)),ZEXT416((uint)fVar59),
                                    ZEXT416((uint)fVar57));
          pfVar5[lVar18] = auVar62._0_4_;
          pbVar6[lVar18] = 0.0 <= fVar59 + fVar57;
          lVar18 = lVar18 + 1;
          iVar32 = iVar32 + iVar2;
        } while (iVar32 < iVar4 * iVar2);
      }
      iVar13 = iVar13 + iVar2;
    } while (iVar13 < iVar17);
  }
  return;
}

Assistant:

void compute_response_layer_Dyy_leftcorner(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer

        optimization:
        - Dyy box filter hand optimized and split into cases (here only leftcorner)
    */
    float Dxx, Dyy, Dxy;
    int x, y;
    int r0, r1, c0, c1, r00, r01, c00, c01, r10, r11, c10, c11;
    float Dyy0, Dyy1;
    float A, B, C, D;
    int k;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size * filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float *) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    /*
        In our optimized function, i and j are raw coordinates in the integral
        / original image. In the original function these coordinates are
        coordinates of the layer. We changed it this way in the optimized function
        because its easier to about corner cases in raw coordinates.
    */

    // Top Left Corner - Case 1: B of neg part outside
    for (int i = 0; i < lobe / 2 + 1; i += step) {  // Inner B is outside, i.e. 0
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {  // c0 = col - 1 = (y - lobe + 1) -1 < 0
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];  // seg fault at: i: 12, j:0

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;  // -1 is already part of r10
            c11 = y + lobe - 1;

            D = data[r11 * data_width + c11];
            Dyy1 = D;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Left Corner - Case 2: B of neg part inside
    // initial value has to be rounded up to next bigger step
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border + 1; i += step) {  // Inner B is inside
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // -1 is already part of r10
            c11 = y + lobe - 1;

            B = data[r10 * data_width + c11];
            D = data[r11 * data_width + c11];
            Dyy1 = D - B;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (lobe + step - 1) / step * step;

    for (int i = 0; i < border + 1; i += step) {
        ind = (i / step) * width + (k / step);

        for (int j = k; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // printf("OPTIMIZED: (%i, %i) - Dyy: %f, Dxx: %f, Dxy: %f\n\n", i, j, Dyy, Dxx, Dxy);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    k = (border + 1 + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}